

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_samplers
          (Impl *this,StateCreatorInterface *iface,Value *samplers)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  size_t size;
  ulonglong uVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  void *__s;
  ConstMemberIterator CVar6;
  Ch *__nptr;
  size_type sVar7;
  Type pGVar8;
  Number NVar9;
  mapped_type *ppVVar10;
  void *pvVar11;
  Pointer this_01;
  bool bVar12;
  double dVar13;
  Hash hash;
  ulonglong local_58;
  StateCreatorInterface *local_50;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_48;
  void *local_40;
  undefined8 local_38;
  
  local_50 = iface;
  if ((samplers->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x49a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::MemberCount() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar5 = (ulong)(samplers->data_).s.length;
  if (uVar5 == 0) {
    __s = (void *)0x0;
  }
  else {
    size = uVar5 * 0x50;
    __s = ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (__s != (void *)0x0) {
      memset(__s,0,size);
    }
  }
  if ((samplers->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x4d8,
                  "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  this_01 = (Pointer)((ulong)(samplers->data_).s.str & 0xffffffffffff);
  CVar6 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(samplers);
  bVar12 = CVar6.ptr_ == this_01;
  if (!bVar12) {
    local_48 = &(this->replayed_samplers)._M_h;
    uVar5 = 0;
    local_40 = __s;
    do {
      __nptr = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(&this_01->name);
      local_58 = strtoull(__nptr,(char **)0x0,0x10);
      sVar7 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(local_48,&local_58);
      bVar4 = 0;
      if (sVar7 == 0) {
        this_00 = &this_01->value;
        *(undefined4 *)((long)__s + uVar5 * 0x50) = 0x1f;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"addressModeU");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) {
LAB_001228ab:
          __assert_fail("data_.f.flags & kUintFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x719,
                        "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        pvVar11 = (void *)(uVar5 * 0x50 + (long)__s);
        *(SizeType *)((long)pvVar11 + 0x20) = (pGVar8->data_).s.length;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"addressModeV");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) goto LAB_001228ab;
        *(SizeType *)((long)pvVar11 + 0x24) = (pGVar8->data_).s.length;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"addressModeW");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) goto LAB_001228ab;
        *(SizeType *)((long)pvVar11 + 0x28) = (pGVar8->data_).s.length;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"anisotropyEnable");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) goto LAB_001228ab;
        *(SizeType *)((long)pvVar11 + 0x30) = (pGVar8->data_).s.length;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"borderColor");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) goto LAB_001228ab;
        *(SizeType *)((long)pvVar11 + 0x48) = (pGVar8->data_).s.length;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"compareEnable");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) goto LAB_001228ab;
        *(SizeType *)((long)pvVar11 + 0x38) = (pGVar8->data_).s.length;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"compareOp");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) goto LAB_001228ab;
        *(SizeType *)((long)pvVar11 + 0x3c) = (pGVar8->data_).s.length;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"flags");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) goto LAB_001228ab;
        *(SizeType *)((long)pvVar11 + 0x10) = (pGVar8->data_).s.length;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"magFilter");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) goto LAB_001228ab;
        *(SizeType *)((long)pvVar11 + 0x14) = (pGVar8->data_).s.length;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"minFilter");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) goto LAB_001228ab;
        *(SizeType *)((long)pvVar11 + 0x18) = (pGVar8->data_).s.length;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"maxAnisotropy");
        dVar13 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetDouble(pGVar8);
        *(float *)((long)pvVar11 + 0x34) = (float)dVar13;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"mipmapMode");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) goto LAB_001228ab;
        *(SizeType *)((long)pvVar11 + 0x1c) = (pGVar8->data_).s.length;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"maxLod");
        dVar13 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetDouble(pGVar8);
        *(float *)((long)pvVar11 + 0x44) = (float)dVar13;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"minLod");
        dVar13 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetDouble(pGVar8);
        *(float *)((long)pvVar11 + 0x40) = (float)dVar13;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"mipLodBias");
        dVar13 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetDouble(pGVar8);
        *(float *)((long)pvVar11 + 0x2c) = (float)dVar13;
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"unnormalizedCoordinates");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) goto LAB_001228ab;
        *(SizeType *)((long)pvVar11 + 0x4c) = (pGVar8->data_).s.length;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&stack0xffffffffffffffc8,(Ch *)this_00);
        uVar2 = local_38;
        NVar9.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        __s = local_40;
        if (uVar2 != NVar9.i64) {
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"pNext");
          bVar3 = parse_pnext_chain(this,pGVar8,(void **)((long)pvVar11 + 8),
                                    (StateCreatorInterface *)0x0,(DatabaseInterface *)0x0,
                                    (Value *)0x0);
          bVar4 = 1;
          if (!bVar3) goto LAB_00122863;
        }
        uVar1 = local_58;
        ppVVar10 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_48,&local_58);
        bVar4 = (**(code **)(*(long *)local_50 + 0x28))(local_50,uVar1,pvVar11,ppVVar10);
        bVar4 = bVar4 ^ 1;
      }
LAB_00122863:
      if ((bVar4 & 3) != 0) {
        return bVar12;
      }
      this_01 = this_01 + 1;
      uVar5 = (ulong)((int)uVar5 + 1);
      CVar6 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::MemberEnd(samplers);
      bVar12 = this_01 == CVar6.ptr_;
    } while (!bVar12);
  }
  (**(code **)(*(long *)local_50 + 0x88))();
  return bVar12;
}

Assistant:

bool StateReplayer::Impl::parse_samplers(StateCreatorInterface &iface, const Value &samplers)
{
	auto *infos = allocator.allocate_n_cleared<VkSamplerCreateInfo>(samplers.MemberCount());

	unsigned index = 0;
	for (auto itr = samplers.MemberBegin(); itr != samplers.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_samplers.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;

		info.addressModeU = static_cast<VkSamplerAddressMode>(obj["addressModeU"].GetUint());
		info.addressModeV = static_cast<VkSamplerAddressMode>(obj["addressModeV"].GetUint());
		info.addressModeW = static_cast<VkSamplerAddressMode>(obj["addressModeW"].GetUint());
		info.anisotropyEnable = obj["anisotropyEnable"].GetUint();
		info.borderColor = static_cast<VkBorderColor>(obj["borderColor"].GetUint());
		info.compareEnable = obj["compareEnable"].GetUint();
		info.compareOp = static_cast<VkCompareOp>(obj["compareOp"].GetUint());
		info.flags = obj["flags"].GetUint();
		info.magFilter = static_cast<VkFilter>(obj["magFilter"].GetUint());
		info.minFilter = static_cast<VkFilter>(obj["minFilter"].GetUint());
		info.maxAnisotropy = obj["maxAnisotropy"].GetFloat();
		info.mipmapMode = static_cast<VkSamplerMipmapMode>(obj["mipmapMode"].GetUint());
		info.maxLod = obj["maxLod"].GetFloat();
		info.minLod = obj["minLod"].GetFloat();
		info.mipLodBias = obj["mipLodBias"].GetFloat();
		info.unnormalizedCoordinates = obj["unnormalizedCoordinates"].GetUint();

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &info.pNext))
				return false;

		if (!iface.enqueue_create_sampler(hash, &info, &replayed_samplers[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}